

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O2

void duckdb::
     LeastGreatestFunction<signed_char,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  data_t dVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  reference pvVar4;
  idx_t i;
  ulong uVar5;
  ulong uVar6;
  VectorType vector_type_p;
  idx_t col_idx;
  ulong uVar7;
  pointer pVVar8;
  pointer pVVar9;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  
  pVVar8 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar9 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pVVar9 - (long)pVVar8 == 0x68) {
    pvVar4 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
    Vector::Reference(result,pvVar4);
    return;
  }
  vector_type_p = CONSTANT_VECTOR;
  for (uVar7 = 0; uVar7 < (ulong)(((long)pVVar9 - (long)pVVar8) / 0x68); uVar7 = uVar7 + 1) {
    pvVar4 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar7);
    if (pvVar4->vector_type != CONSTANT_VECTOR) {
      vector_type_p = FLAT_VECTOR;
    }
    pVVar8 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar9 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  pdVar2 = result->data;
  uVar7 = 0;
  switchD_014c3389::default(result_has_value,0,0x800);
  do {
    if ((ulong)(((long)pVVar9 - (long)pVVar8) / 0x68) <= uVar7) {
      StandardLeastGreatest<false>::FinalizeResult(args->count,result_has_value,result,state);
      Vector::SetVectorType(result,vector_type_p);
      return;
    }
    pvVar4 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar7);
    if (pvVar4->vector_type == CONSTANT_VECTOR) {
      pvVar4 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar7);
      puVar3 = (pvVar4->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) goto LAB_01cf6b14;
    }
    else {
LAB_01cf6b14:
      UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
      pvVar4 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar7);
      Vector::ToUnifiedFormat(pvVar4,args->count,&vdata);
      if (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        for (uVar5 = 0; uVar5 < args->count; uVar5 = uVar5 + 1) {
          uVar6 = uVar5;
          if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar6 = (ulong)(vdata.sel)->sel_vector[uVar5];
          }
          dVar1 = vdata.data[uVar6];
          if ((result_has_value[uVar5] != true) || ((char)pdVar2[uVar5] < (char)dVar1)) {
            result_has_value[uVar5] = true;
            pdVar2[uVar5] = dVar1;
          }
        }
      }
      else {
        for (uVar5 = 0; uVar5 < args->count; uVar5 = uVar5 + 1) {
          uVar6 = uVar5;
          if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar6 = (ulong)(vdata.sel)->sel_vector[uVar5];
          }
          if (((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) ||
              ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar6 >> 6]
                >> (uVar6 & 0x3f) & 1) != 0)) &&
             ((dVar1 = vdata.data[uVar6], result_has_value[uVar5] != true ||
              ((char)pdVar2[uVar5] < (char)dVar1)))) {
            result_has_value[uVar5] = true;
            pdVar2[uVar5] = dVar1;
          }
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
    }
    uVar7 = uVar7 + 1;
    pVVar8 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar9 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}